

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib537.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  CURL *curl;
  CURLcode res;
  char *URL_local;
  
  iVar1 = strcmp(URL,"check");
  if (iVar1 == 0) {
    iVar1 = rlimit(0);
    if (iVar1 == 0) {
      URL_local._4_4_ = 0;
    }
    else {
      fprintf(_stdout,"rlimit problem: %s\n",msgbuff);
      URL_local._4_4_ = 1;
    }
  }
  else {
    iVar1 = rlimit(1);
    if (iVar1 == 0) {
      iVar1 = curl_global_init(3);
      if (iVar1 == 0) {
        lVar2 = curl_easy_init();
        if (lVar2 == 0) {
          fprintf(_stderr,"curl_easy_init() failed\n");
          close_file_descriptors();
          curl_global_cleanup();
          URL_local._4_4_ = 0x7e;
        }
        else {
          curl._4_4_ = curl_easy_setopt(lVar2,0x2712,URL);
          if ((curl._4_4_ == 0) && (curl._4_4_ = curl_easy_setopt(lVar2,0x2a,1), curl._4_4_ == 0)) {
            curl._4_4_ = curl_easy_perform(lVar2);
          }
          close_file_descriptors();
          curl_easy_cleanup(lVar2);
          curl_global_cleanup();
          URL_local._4_4_ = curl._4_4_;
        }
      }
      else {
        fprintf(_stderr,"curl_global_init() failed\n");
        close_file_descriptors();
        URL_local._4_4_ = 0x7e;
      }
    }
    else {
      URL_local._4_4_ = 0x7e;
    }
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;

  if(!strcmp(URL, "check")) {
    /* used by the test script to ask if we can run this test or not */
    if(rlimit(FALSE)) {
      fprintf(stdout, "rlimit problem: %s\n", msgbuff);
      return 1;
    }
    return 0; /* sure, run this! */
  }

  if (rlimit(TRUE)) {
    /* failure */
    return TEST_ERR_MAJOR_BAD;
  }

  /* run the test with the bunch of open file descriptors
     and close them all once the test is over */

  if (curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    close_file_descriptors();
    return TEST_ERR_MAJOR_BAD;
  }

  if ((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    close_file_descriptors();
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_HEADER, 1L);

  res = curl_easy_perform(curl);

test_cleanup:

  close_file_descriptors();
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}